

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

Value * __thiscall
BasicBlock::GetValueForConditionalBranch
          (BasicBlock *this,BranchInstr *branch,Opnd *opnd,GlobOpt *globOpt,
          GlobHashTable *localSymToValueMap)

{
  bool bVar1;
  SymID id;
  StackSym *pSVar2;
  Value *pVVar3;
  
  if ((opnd != (Opnd *)0x0) && (pSVar2 = IR::Opnd::GetStackSym(opnd), pSVar2 != (StackSym *)0x0)) {
    pSVar2 = IR::Opnd::GetStackSym(opnd);
    pVVar3 = FindValueInLocalThenGlobalValueTableAndUpdate
                       (this,globOpt,localSymToValueMap,&branch->super_Instr,(Sym *)0x0,
                        &pSVar2->super_Sym);
    if (pVVar3 == (Value *)0x0) {
      return (Value *)0x0;
    }
    if (this->loop == (Loop *)0x0) {
      return pVVar3;
    }
    id = GlobOpt::GetVarSymID(globOpt,pSVar2);
    if (id == (pSVar2->super_Sym).m_id) {
      return pVVar3;
    }
    bVar1 = Loop::IsSymAssignedToInSelfOrParents(this->loop,id);
    if (!bVar1) {
      return pVVar3;
    }
  }
  return (Value *)0x0;
}

Assistant:

Value* BasicBlock::GetValueForConditionalBranch(
    IR::BranchInstr* branch,
    IR::Opnd* opnd,
    GlobOpt* globOpt,
    GlobHashTable* localSymToValueMap)
{
    if (!opnd || !opnd->GetStackSym())
    {
        return nullptr;
    }

    StackSym* sym = opnd->GetStackSym();

    Value* val = FindValueInLocalThenGlobalValueTableAndUpdate(
        globOpt,
        localSymToValueMap,
        branch,
        nullptr,
        sym);

    if (val != nullptr && this->loop)
    {
        // If this branch is within a loop, the stack sym is type specialized, and the associated
        // var sym is written to within the loop, then we cannot prove the condition: additional
        // assignments to the type specialized sym might be inserted in a later block.
        SymID varSymID = globOpt->GetVarSymID(sym);
        if (varSymID != sym->m_id && this->loop->IsSymAssignedToInSelfOrParents(varSymID))
        {
            return nullptr;
        }
    }

    return val;
}